

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

size_t quantize_iq1_m(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  undefined8 *puVar1;
  ushort *puVar2;
  char cVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int i;
  int iVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  uint uVar14;
  ulong uVar15;
  int *piVar16;
  float *pfVar17;
  ulong uVar18;
  undefined *puVar19;
  int i_1;
  uint uVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  byte bVar24;
  char *pcVar25;
  float *pfVar26;
  undefined *puVar27;
  ulong uVar28;
  char *pcVar29;
  ulong uVar30;
  ulong uVar31;
  int k;
  ulong uVar32;
  undefined *puVar33;
  int iVar34;
  ulong uVar35;
  int ib;
  ulong uVar36;
  int i_3;
  int iVar37;
  float *pfVar38;
  bool bVar39;
  bool bVar40;
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  anon_union_4_2_5fd15f10 fp32;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  uint uVar48;
  float fVar49;
  uint uVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  uint16_t index [2];
  int8_t L [16];
  float weight [16];
  int8_t shifts [16];
  float pairs [32];
  float scales [16];
  int in_stack_fffffffffffffd98;
  undefined1 local_258 [12];
  float fStack_24c;
  undefined1 local_248 [12];
  float fStack_23c;
  ushort local_22c [2];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  long local_200;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  void *local_1e0;
  char local_1d8 [16];
  float *local_1c8;
  float *local_1c0;
  float *local_1b8;
  uint64_t *local_1b0;
  undefined8 local_1a8;
  float fStack_1a0;
  float fStack_19c;
  void *local_190;
  float *local_188;
  uint16_t *local_180;
  long local_178;
  long local_170;
  int64_t local_168;
  long local_160;
  long local_158;
  int *local_150;
  float local_148 [16];
  char acStack_108 [16];
  undefined8 local_f8;
  int local_ec;
  float afStack_e8 [46];
  
  local_1b8 = quant_weights;
  local_190 = dst;
  local_1c8 = src;
  if ((char)n_per_row != '\0') {
    pcVar25 = "n_per_row%QK_K == 0";
    iVar37 = 0x11bf;
LAB_00139307:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,iVar37,"GGML_ASSERT(%s) failed",pcVar25);
  }
  local_200 = n_per_row >> 8;
  if (0 < nrow) {
    local_178 = (n_per_row >> 8) * 0x38;
    lVar12 = 0;
    local_168 = nrow;
    local_170 = n_per_row << 2;
    do {
      local_1b0 = iq2_data[2].grid;
      if (iq2_data[2].grid == (uint64_t *)0x0) {
        pcVar25 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar37 = 0x10d5;
        goto LAB_00139307;
      }
      local_150 = iq2_data[2].map;
      if (iq2_data[2].map == (int *)0x0) {
        pcVar25 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar37 = 0x10d6;
        goto LAB_00139307;
      }
      local_180 = iq2_data[2].neighbours;
      if (iq2_data[2].neighbours == (uint16_t *)0x0) {
        pcVar25 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar37 = 0x10d7;
        goto LAB_00139307;
      }
      local_160 = lVar12;
      if (0 < local_200) {
        local_180 = iq2_data[2].neighbours + -1;
        local_1c0 = local_1b8;
        lVar12 = 0;
        pfVar23 = local_1c8;
        do {
          lVar11 = lVar12 * 0x38;
          local_1e0 = (void *)((long)local_190 + lVar11);
          local_158 = lVar12;
          pfVar38 = local_1c8 + lVar12 * 0x100;
          puVar1 = (undefined8 *)((long)local_190 + lVar11 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)local_190 + lVar11 + 0x10);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)local_190 + lVar11) = 0;
          ((undefined8 *)((long)local_190 + lVar11))[1] = 0;
          *(undefined8 *)((long)local_190 + lVar11 + 0x30) = 0;
          fVar46 = 0.0;
          lVar12 = 0;
          do {
            fVar46 = fVar46 + pfVar23[lVar12] * pfVar23[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x100);
          fVar46 = (fVar46 + fVar46) * 0.00390625;
          auVar43 = ZEXT816(0);
          lVar12 = 0;
          local_1f8 = pfVar23;
          local_188 = pfVar38;
          pfVar13 = local_1c0;
          pfVar17 = pfVar23;
          do {
            local_218 = auVar43;
            if (local_1b8 == (float *)0x0) {
              lVar11 = 0;
              do {
                pfVar26 = pfVar23 + lVar11;
                fVar41 = pfVar26[1];
                fVar47 = pfVar26[2];
                fVar49 = pfVar26[3];
                local_148[lVar11] = *pfVar26 * *pfVar26;
                local_148[lVar11 + 1] = fVar41 * fVar41;
                local_148[lVar11 + 2] = fVar47 * fVar47;
                local_148[lVar11 + 3] = fVar49 * fVar49;
                lVar11 = lVar11 + 4;
              } while (lVar11 != 0x10);
            }
            else {
              lVar11 = 0;
              do {
                fVar41 = pfVar23[lVar11] * pfVar23[lVar11] + fVar46;
                if (fVar41 < 0.0) {
                  local_228._0_4_ = pfVar13[lVar11];
                  fVar41 = sqrtf(fVar41);
                  fVar47 = (float)local_228._0_4_;
                }
                else {
                  fVar41 = SQRT(fVar41);
                  fVar47 = pfVar13[lVar11];
                }
                local_148[lVar11] = fVar47 * fVar41;
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x10);
            }
            local_1a8 = lVar12;
            pfVar26 = pfVar38 + lVar12 * 0x10;
            auVar45 = ZEXT416((uint)ABS(*pfVar26));
            lVar11 = 1;
            do {
              if (auVar45._0_4_ <= ABS(pfVar23[lVar11])) {
                auVar45._0_4_ = ABS(pfVar23[lVar11]);
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x10);
            if (1e-07 <= auVar45._0_4_) {
              lVar12 = 0;
              iVar37 = 0;
              fVar41 = 1.4013e-45;
              do {
                fVar47 = (pfVar23 + lVar12)[1];
                (&local_f8)[lVar12] = CONCAT44(iVar37,pfVar23[lVar12]);
                afStack_e8[lVar12 * 2] = fVar47;
                afStack_e8[lVar12 * 2 + 1] = fVar41;
                lVar12 = lVar12 + 2;
                iVar37 = iVar37 + 2;
                fVar41 = (float)((int)fVar41 + 2);
              } while (lVar12 != 0x10);
              local_228 = auVar45;
              local_1e8 = pfVar23;
              qsort(&local_f8,0x10,8,iq1_sort_helper);
              uVar35 = 0xffffffff;
              uVar18 = 0xffffffffffffffff;
              lVar12 = (long)&local_f8 + 4;
              uVar28 = 0;
              fVar47 = -1.1754944e-38;
              uVar36 = 0xffffffff;
              uVar15 = 0xffffffff;
              fVar41 = (float)local_228._0_4_;
              uVar20 = local_228._4_4_;
              uVar48 = local_228._8_4_;
              uVar50 = local_228._12_4_;
              do {
                lVar11 = 0;
                uVar30 = uVar18;
                uVar31 = uVar28;
                do {
                  fVar49 = 0.0;
                  fVar51 = 0.0;
                  _local_248 = (undefined1  [16])0x0;
                  _local_258 = (undefined1  [16])0x0;
                  local_228._4_4_ = uVar20;
                  local_228._0_4_ = fVar41;
                  local_228._8_4_ = uVar48;
                  local_228._12_4_ = uVar50;
                  if (uVar28 != 0) {
                    fVar42 = 0.0;
                    fVar44 = 0.0;
                    fStack_23c = 0.0;
                    local_258._4_8_ = 0;
                    fStack_24c = 0.0;
                    uVar32 = 0;
                    do {
                      lVar21 = (long)*(int *)((long)&local_f8 + uVar32 * 8 + 4);
                      if (lVar21 < 8) {
                        fVar59 = pfVar26[lVar21];
                        fVar52 = local_148[lVar21] * -0.875;
                        fVar54 = local_148[lVar21] * -1.125;
                        fVar58 = fVar54 * fVar59;
                        fVar56 = fVar59 * fVar52;
                        fVar57 = fVar59 * fVar54;
                        fVar59 = fVar59 * fVar52;
                        fVar53 = fVar52 * -0.875;
                        fVar55 = fVar54 * -1.125;
                      }
                      else {
                        fVar59 = pfVar26[lVar21];
                        fVar54 = local_148[lVar21] * -1.125;
                        fVar52 = local_148[lVar21] * -0.875;
                        fVar58 = fVar54 * fVar59;
                        fVar56 = fVar59 * fVar54;
                        fVar57 = fVar59 * fVar52;
                        fVar59 = fVar59 * fVar52;
                        fVar53 = fVar54 * -1.125;
                        fVar55 = fVar52 * -0.875;
                      }
                      fVar51 = fVar51 + fVar59;
                      fVar49 = fVar49 + fVar52 * -0.875;
                      fStack_23c = fStack_23c + fVar58;
                      fVar44 = fVar44 + fVar57;
                      fVar42 = fVar42 + fVar56;
                      local_258._4_8_ =
                           CONCAT44((float)((ulong)local_258._4_8_ >> 0x20) + fVar55,
                                    (float)local_258._4_8_ + fVar53);
                      fStack_24c = fStack_24c + fVar54 * -1.125;
                      uVar32 = uVar32 + 1;
                    } while (uVar28 != uVar32);
                    auVar8._4_4_ = fVar44;
                    auVar8._0_4_ = fVar42;
                    auVar8._8_4_ = fStack_23c;
                    auVar8._12_4_ = 0;
                    _local_248 = auVar8 << 0x20;
                    auVar9._8_4_ = fStack_24c;
                    auVar9._0_8_ = local_258._4_8_;
                    auVar9._12_4_ = 0;
                    _local_258 = auVar9 << 0x20;
                  }
                  auVar45 = _local_248;
                  auVar43 = _local_258;
                  local_248._0_4_ = fVar51;
                  local_258._0_4_ = fVar49;
                  if (uVar28 < uVar31) {
                    local_248._4_8_ = auVar45._4_8_;
                    fStack_23c = auVar45._12_4_;
                    fVar59 = auVar43._4_4_;
                    fVar56 = auVar43._8_4_;
                    fStack_24c = auVar43._12_4_;
                    lVar21 = 0;
                    fVar42 = fStack_23c;
                    fVar44 = fStack_24c;
                    do {
                      lVar22 = (long)*(int *)(lVar12 + lVar21 * 8);
                      fVar57 = (float)((ulong)local_248._4_8_ >> 0x20);
                      if (lVar22 < 8) {
                        fVar58 = pfVar26[lVar22];
                        fVar54 = local_148[lVar22] * 0.125;
                        fVar53 = local_148[lVar22] * -0.125;
                        fVar52 = fVar53 * fVar58;
                        local_248._4_8_ =
                             CONCAT44(fVar57 + fVar58 * fVar53,
                                      (float)local_248._4_8_ + fVar58 * fVar54);
                        fVar58 = fVar58 * fVar54;
                        fVar57 = fVar54 * 0.125;
                        fVar55 = fVar53 * -0.125;
                      }
                      else {
                        fVar58 = pfVar26[lVar22];
                        fVar53 = local_148[lVar22] * -0.125;
                        fVar54 = local_148[lVar22] * 0.125;
                        fVar52 = fVar53 * fVar58;
                        local_248._4_8_ =
                             CONCAT44(fVar57 + fVar58 * fVar54,
                                      (float)local_248._4_8_ + fVar58 * fVar53);
                        fVar58 = fVar58 * fVar54;
                        fVar57 = fVar53 * -0.125;
                        fVar55 = fVar54 * 0.125;
                      }
                      fVar51 = fVar51 + fVar58;
                      fVar49 = fVar49 + fVar54 * 0.125;
                      fVar42 = fVar42 + fVar52;
                      fVar59 = fVar59 + fVar57;
                      fVar56 = fVar56 + fVar55;
                      fVar44 = fVar44 + fVar53 * -0.125;
                      lVar21 = lVar21 + 1;
                    } while (lVar11 != lVar21);
                    auVar4._8_4_ = fStack_23c;
                    auVar4._0_8_ = local_248._4_8_;
                    local_248 = auVar4 << 0x20;
                    fStack_23c = fVar42;
                    auVar5._4_4_ = fVar56;
                    auVar5._0_4_ = fVar59;
                    auVar5._8_4_ = fStack_24c;
                    local_258 = auVar5 << 0x20;
                    fStack_24c = fVar44;
                  }
                  auVar45 = _local_248;
                  auVar43 = _local_258;
                  local_248._0_4_ = fVar51;
                  local_258._0_4_ = fVar49;
                  if (uVar31 < 0x10) {
                    local_248._4_8_ = auVar45._4_8_;
                    fStack_23c = auVar45._12_4_;
                    fVar59 = auVar43._4_4_;
                    fVar56 = auVar43._8_4_;
                    fStack_24c = auVar43._12_4_;
                    uVar32 = uVar30;
                    fVar42 = fStack_23c;
                    fVar44 = fStack_24c;
                    do {
                      lVar21 = (long)(&local_ec)[uVar32 * 2];
                      fVar57 = (float)((ulong)local_248._4_8_ >> 0x20);
                      if (lVar21 < 8) {
                        fVar58 = pfVar26[lVar21];
                        fVar54 = local_148[lVar21] * 1.125;
                        fVar53 = local_148[lVar21] * 0.875;
                        fVar52 = fVar53 * fVar58;
                        local_248._4_8_ =
                             CONCAT44(fVar57 + fVar58 * fVar53,
                                      (float)local_248._4_8_ + fVar58 * fVar54);
                        fVar58 = fVar58 * fVar54;
                        fVar57 = fVar54 * 1.125;
                        fVar55 = fVar53 * 0.875;
                      }
                      else {
                        fVar58 = pfVar26[lVar21];
                        fVar53 = local_148[lVar21] * 0.875;
                        fVar54 = local_148[lVar21] * 1.125;
                        fVar52 = fVar53 * fVar58;
                        local_248._4_8_ =
                             CONCAT44(fVar57 + fVar58 * fVar54,
                                      (float)local_248._4_8_ + fVar58 * fVar53);
                        fVar58 = fVar58 * fVar54;
                        fVar57 = fVar53 * 0.875;
                        fVar55 = fVar54 * 1.125;
                      }
                      fVar51 = fVar51 + fVar58;
                      fVar49 = fVar49 + fVar54 * 1.125;
                      fVar42 = fVar42 + fVar52;
                      fVar59 = fVar59 + fVar57;
                      fVar56 = fVar56 + fVar55;
                      fVar44 = fVar44 + fVar53 * 0.875;
                      uVar32 = uVar32 + 1;
                    } while (uVar32 < 0xf);
                    auVar6._8_4_ = fStack_23c;
                    auVar6._0_8_ = local_248._4_8_;
                    local_248 = auVar6 << 0x20;
                    fStack_23c = fVar42;
                    auVar7._4_4_ = fVar56;
                    auVar7._0_4_ = fVar59;
                    auVar7._8_4_ = fStack_24c;
                    local_258 = auVar7 << 0x20;
                    fStack_24c = fVar44;
                  }
                  local_248._0_4_ = fVar51;
                  local_258._0_4_ = fVar49;
                  uVar32 = 0;
                  do {
                    fVar49 = *(float *)(local_258 + uVar32 * 4);
                    if ((0.0 < fVar49) &&
                       (fVar51 = *(float *)(local_248 + uVar32 * 4),
                       fVar47 * fVar49 < fVar51 * fVar51)) {
                      uVar20 = 0;
                      uVar48 = 0;
                      uVar50 = 0;
                      fVar41 = fVar51 / fVar49;
                      fVar47 = fVar51 * fVar41;
                      uVar15 = uVar28 & 0xffffffff;
                      uVar36 = uVar31 & 0xffffffff;
                      uVar35 = uVar32 & 0xffffffff;
                    }
                    uVar32 = uVar32 + 1;
                  } while (uVar32 != 4);
                  uVar31 = uVar31 + 1;
                  lVar11 = lVar11 + 1;
                  uVar30 = uVar30 + 1;
                } while (uVar31 != 0x11);
                uVar28 = uVar28 + 1;
                lVar12 = lVar12 + 8;
                uVar18 = uVar18 + 1;
              } while (uVar28 != 0x11);
              iVar37 = (int)uVar15;
              if (((iVar37 < 0) || (iVar10 = (int)uVar36, iVar10 < 0)) ||
                 (iVar34 = (int)uVar35, iVar34 < 0)) {
                pcVar25 = "besti1 >= 0 && besti2 >= 0 && best_k >= 0";
                iVar37 = 0x1165;
                goto LAB_00139307;
              }
              if (0 < iVar37) {
                uVar18 = 0;
                do {
                  local_1d8[*(int *)((long)&local_f8 + uVar18 * 8 + 4)] = '\0';
                  uVar18 = uVar18 + 1;
                } while (uVar15 != uVar18);
              }
              if (iVar37 < iVar10) {
                piVar16 = (int *)((long)&local_f8 + uVar15 * 8 + 4);
                do {
                  local_1d8[*piVar16] = '\x01';
                  uVar14 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar14;
                  piVar16 = piVar16 + 2;
                } while ((int)uVar14 < iVar10);
              }
              if (iVar10 < 0x10) {
                iVar10 = iVar10 + -1;
                piVar16 = (int *)((long)&local_f8 + uVar36 * 8 + 4);
                do {
                  local_1d8[*piVar16] = '\x02';
                  iVar10 = iVar10 + 1;
                  piVar16 = piVar16 + 2;
                } while (iVar10 < 0xf);
              }
              local_1f0 = pfVar13;
              if (fVar41 < 0.0) {
                local_1d8[1] = '\x02' - local_1d8[1];
                local_1d8[0] = '\x02' - local_1d8[0];
                local_1d8[2] = '\x02' - local_1d8[2];
                local_1d8[3] = '\x02' - local_1d8[3];
                local_1d8[4] = '\x02' - local_1d8[4];
                local_1d8[5] = '\x02' - local_1d8[5];
                local_1d8[6] = '\x02' - local_1d8[6];
                local_1d8[7] = '\x02' - local_1d8[7];
                local_1d8[9] = '\x02' - local_1d8[9];
                local_1d8[8] = '\x02' - local_1d8[8];
                local_1d8[10] = '\x02' - local_1d8[10];
                local_1d8[0xb] = '\x02' - local_1d8[0xb];
                local_1d8[0xc] = '\x02' - local_1d8[0xc];
                local_1d8[0xd] = '\x02' - local_1d8[0xd];
                local_1d8[0xe] = '\x02' - local_1d8[0xe];
                local_1d8[0xf] = '\x02' - local_1d8[0xf];
                fVar41 = -fVar41;
                uVar20 = uVar20 ^ 0x80000000;
                uVar48 = uVar48 ^ 0x80000000;
                uVar50 = uVar50 ^ 0x80000000;
                if (iVar34 == 0) {
                  uVar35 = 3;
                }
                else if (iVar34 == 1) {
                  uVar35 = 2;
                }
                else {
                  uVar35 = (ulong)(iVar34 == 2);
                }
              }
              pfVar23 = (float *)&DAT_0015958c;
              pfVar38 = (float *)&DAT_0015958c;
              if ((uVar35 & 1) == 0) {
                pfVar38 = (float *)&DAT_00159580;
              }
              if ((int)uVar35 < 2) {
                pfVar23 = (float *)&DAT_00159580;
              }
              bVar40 = true;
              pcVar25 = local_1d8;
              local_228._4_4_ = uVar20;
              local_228._0_4_ = fVar41;
              local_228._8_4_ = uVar48;
              local_228._12_4_ = uVar50;
              lVar12 = 0;
              auVar43 = local_218;
              do {
                lVar11 = 0;
                uVar20 = 0;
                pcVar29 = pcVar25;
                do {
                  uVar20 = uVar20 | (int)*pcVar29 << ((byte)lVar11 & 0x1f);
                  pcVar29 = pcVar29 + 1;
                  lVar11 = lVar11 + 2;
                } while (lVar11 != 0x10);
                uVar36 = (ulong)local_150[uVar20 & 0xffff];
                if ((long)uVar36 < 0) {
                  pfVar13 = pfVar38;
                  if (lVar12 == 0) {
                    pfVar13 = pfVar23;
                  }
                  uVar20 = iq1_find_best_neighbour2
                                     (local_180 + -uVar36,local_1b0,pfVar26 + lVar12 * 8,
                                      local_148 + lVar12 * 8,fVar41,pfVar13,local_1d8 + lVar12 * 8,
                                      in_stack_fffffffffffffd98);
                  uVar36 = (ulong)uVar20;
                  bVar40 = false;
                  auVar43 = local_218;
                  fVar41 = (float)local_228._0_4_;
                }
                local_22c[lVar12] = (ushort)uVar36;
                pcVar25 = pcVar25 + 8;
                bVar39 = lVar12 == 0;
                lVar12 = lVar12 + 1;
              } while (bVar39);
              if (!bVar40) {
                fVar47 = 0.0;
                fVar49 = 0.0;
                pfVar13 = local_148;
                pfVar17 = local_1e8;
                lVar12 = 0;
                do {
                  pfVar26 = pfVar38;
                  if (lVar12 == 0) {
                    pfVar26 = pfVar23;
                  }
                  lVar11 = 0;
                  do {
                    iVar37 = (int)*(char *)((long)local_1b0 + lVar11 + (ulong)local_22c[lVar12] * 8)
                    ;
                    fVar51 = pfVar13[lVar11] *
                             pfVar26[(short)((iVar37 - (iVar37 + -1 >> 0x1f)) - 1U >> 1)];
                    fVar47 = fVar47 + pfVar26[(short)((iVar37 - (iVar37 + -1 >> 0x1f)) - 1U >> 1)] *
                                      fVar51;
                    fVar49 = fVar49 + pfVar17[lVar11] * fVar51;
                    lVar11 = lVar11 + 1;
                  } while (lVar11 != 8);
                  pfVar17 = pfVar17 + 8;
                  pfVar13 = pfVar13 + 8;
                  bVar40 = lVar12 == 0;
                  lVar12 = lVar12 + 1;
                } while (bVar40);
                auVar43 = local_218;
                if (0.0 < fVar49 && 0.0 < fVar47) {
                  fVar41 = fVar49 / fVar47;
                }
              }
              *(char *)((long)local_1e0 + local_1a8 * 2) = (char)local_22c[0];
              *(char *)((long)local_1e0 + local_1a8 * 2 + 1) = (char)local_22c[1];
              *(byte *)((long)local_1e0 + local_1a8 + 0x20) =
                   (byte)(local_22c[1] >> 4) & 0xf0 | (byte)(local_22c[0] >> 8);
              if (fVar41 < 0.0) {
                pcVar25 = "scale >= 0";
                iVar37 = 0x118f;
                goto LAB_00139307;
              }
              afStack_e8[local_1a8 + 0x1c] = fVar41;
              acStack_108[local_1a8] = (char)uVar35;
              pfVar13 = local_1f0;
              pfVar23 = local_1e8;
              pfVar38 = local_188;
              pfVar17 = local_1f8;
              if (auVar43._0_4_ <= fVar41) {
                auVar43._0_4_ = fVar41;
              }
            }
            else {
              afStack_e8[lVar12 + 0x1c] = 0.0;
              builtin_strncpy(local_1d8,
                              "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                              0x10);
              auVar43 = local_218;
            }
            lVar12 = local_1a8 + 1;
            pfVar23 = pfVar23 + 0x10;
            pfVar13 = pfVar13 + 0x10;
          } while (lVar12 != 0x10);
          fVar41 = auVar43._0_4_;
          if ((fVar41 != 0.0) || (NAN(fVar41))) {
            local_218._4_4_ = auVar43._4_4_;
            local_218._0_4_ = fVar41 / 15.0;
            local_218._8_4_ = auVar43._8_4_;
            local_218._12_4_ = auVar43._12_4_;
            local_1f0 = (float *)CONCAT44(local_1f0._4_4_,1.0 / (fVar41 / 15.0));
            fVar41 = 0.0;
            fVar47 = 0.0;
            fVar49 = 0.0;
            fVar51 = 0.0;
            uVar36 = 0;
            pfVar23 = local_1c0;
            do {
              uVar20 = (uint)((afStack_e8[uVar36 + 0x1c] * local_1f0._0_4_ + -1.0) * 0.5 +
                             12582912.0) & 0x7fffff;
              if (0x400006 < uVar20) {
                uVar20 = 0x400007;
              }
              if (uVar20 < 0x400001) {
                uVar20 = 0x400000;
              }
              puVar2 = (ushort *)((long)local_1e0 + (uVar36 >> 2 & 0x3fffffff) * 2 + 0x30);
              *puVar2 = *puVar2 | (ushort)(uVar20 << ((byte)uVar36 & 3) * '\x03');
              cVar3 = acStack_108[uVar36];
              bVar24 = *(byte *)((long)local_1e0 + uVar36 + 0x20) |
                       *(byte *)((float *)(long)cVar3 + 0x53afa);
              *(byte *)((long)local_1e0 + uVar36 + 0x20) = bVar24;
              local_1e8 = (float *)(long)cVar3;
              if (local_1b8 == (float *)0x0) {
                lVar12 = 0;
                do {
                  pfVar38 = pfVar17 + lVar12;
                  fVar42 = pfVar38[1];
                  fVar44 = pfVar38[2];
                  fVar59 = pfVar38[3];
                  local_148[lVar12] = *pfVar38 * *pfVar38;
                  local_148[lVar12 + 1] = fVar42 * fVar42;
                  local_148[lVar12 + 2] = fVar44 * fVar44;
                  local_148[lVar12 + 3] = fVar59 * fVar59;
                  lVar12 = lVar12 + 4;
                } while (lVar12 != 0x10);
              }
              else {
                lVar12 = 0;
                local_1a8 = CONCAT44(fVar47,fVar41);
                fStack_1a0 = fVar49;
                fStack_19c = fVar51;
                do {
                  fVar42 = pfVar17[lVar12] * pfVar17[lVar12] + fVar46;
                  if (fVar42 < 0.0) {
                    local_228._0_4_ = pfVar23[lVar12];
                    fVar42 = sqrtf(fVar42);
                    fVar41 = (float)local_1a8;
                    fVar47 = local_1a8._4_4_;
                    fVar49 = fStack_1a0;
                    fVar51 = fStack_19c;
                    fVar44 = (float)local_228._0_4_;
                  }
                  else {
                    fVar42 = SQRT(fVar42);
                    fVar44 = pfVar23[lVar12];
                  }
                  local_148[lVar12] = fVar44 * fVar42;
                  lVar12 = lVar12 + 1;
                } while (lVar12 != 0x10);
              }
              puVar27 = &DAT_0015958c;
              puVar19 = &DAT_0015958c;
              if (((ulong)local_1e8 & 1) == 0) {
                puVar19 = &DAT_00159580;
              }
              if ((char)local_1e8 < '\x02') {
                puVar27 = &DAT_00159580;
              }
              pfVar38 = local_148;
              pfVar13 = pfVar17;
              lVar12 = 0;
              do {
                puVar33 = puVar19;
                if (lVar12 == 0) {
                  puVar33 = puVar27;
                }
                lVar11 = 0;
                do {
                  iVar37 = (int)*(char *)((long)local_1b0 +
                                         lVar11 + (ulong)((uint)bVar24 <<
                                                          ((char)lVar12 * -4 + 8U & 0x1f) & 0x700) *
                                                  8 + (ulong)*(byte *)((long)local_1e0 +
                                                                      lVar12 + uVar36 * 2) * 8);
                  fVar42 = *(float *)(puVar33 +
                                     (long)(short)((iVar37 - (iVar37 + -1 >> 0x1f)) - 1U >> 1) * 4)
                           * (float)(int)(uVar20 * 2 + -0x7fffff);
                  fVar44 = pfVar38[lVar11] * fVar42;
                  fVar41 = fVar41 + fVar42 * fVar44;
                  fVar47 = fVar47 + pfVar13[lVar11] * fVar44;
                  fVar49 = fVar49 + fVar44 * 0.0;
                  fVar51 = fVar51 + fVar44 * 0.0;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 8);
                pfVar13 = pfVar13 + 8;
                pfVar38 = pfVar38 + 8;
                bVar40 = lVar12 == 0;
                lVar12 = lVar12 + 1;
              } while (bVar40);
              uVar36 = uVar36 + 1;
              pfVar17 = pfVar17 + 0x10;
              pfVar23 = pfVar23 + 0x10;
            } while (uVar36 != 0x10);
            fVar41 = (float)(~-(uint)(0.0 < fVar41) & local_218._0_4_ |
                            (uint)(fVar47 / fVar41) & -(uint)(0.0 < fVar41)) * 1.1125;
            fVar46 = (float)(((uint)fVar41 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar41 * 2) < 0x71000000) {
              fVar46 = 2.0;
            }
            fVar46 = fVar46 + ABS(fVar41) * 5.192297e+33 * 7.70372e-34;
            uVar20 = ((uint)fVar46 & 0xfff) + ((uint)fVar46 >> 0xd & 0x7c00);
            if (0xff000000 < (uint)((int)fVar41 * 2)) {
              uVar20 = 0x7e00;
            }
            *(uint *)((long)local_1e0 + 0x30) =
                 (uVar20 & 0xf) << 0xc | (uint)((ushort)(uVar20 << 8) & 0xf000) << 0x10 |
                 *(uint *)((long)local_1e0 + 0x30);
            *(uint *)((long)local_1e0 + 0x34) =
                 *(uint *)((long)local_1e0 + 0x34) |
                 ((uVar20 & 0xfff) << 4 | ((uint)fVar41 >> 0x10 & 0x8000 | uVar20) << 0x10) &
                 (uint)DAT_0014eb10;
            pfVar17 = local_1f8;
          }
          lVar12 = local_158 + 1;
          pfVar23 = pfVar17 + 0x100;
          local_1c0 = local_1c0 + 0x100;
        } while (lVar12 != local_200);
      }
      local_1c8 = (float *)((long)local_1c8 + local_170);
      local_190 = (void *)((long)local_190 + local_178);
      lVar12 = local_160 + 1;
      nrow = local_168;
    } while (lVar12 != local_168);
  }
  return nrow * local_200 * 0x38;
}

Assistant:

size_t quantize_iq1_m(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    float  scales[QK_K/IQ1M_BLOCK_SIZE];
    float  weight[IQ1M_BLOCK_SIZE];
    int8_t L[IQ1M_BLOCK_SIZE];
    float  pairs[2*IQ1M_BLOCK_SIZE];
    uint16_t index[IQ1M_BLOCK_SIZE/8];
    int8_t shifts[QK_K/IQ1M_BLOCK_SIZE];
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq1_m_impl(src, qrow, n_per_row, quant_weights, scales, weight, pairs, L, index, shifts);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq1_m);
    }
    return nrow * nblock * sizeof(block_iq1_m);
}